

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

FileFormat cmSystemTools::GetFileFormat(char *cext)

{
  int iVar1;
  size_t sVar2;
  FileFormat FVar3;
  string ext;
  long *local_38 [2];
  long local_28 [2];
  
  FVar3 = NO_FILE_FORMAT;
  if ((cext != (char *)0x0) && (FVar3 = NO_FILE_FORMAT, *cext != '\0')) {
    local_38[0] = local_28;
    sVar2 = strlen(cext);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,cext,cext + sVar2);
    iVar1 = std::__cxx11::string::compare((char *)local_38);
    FVar3 = C_FILE_FORMAT;
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)local_38);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)local_38);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)local_38);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)local_38);
            FVar3 = CXX_FILE_FORMAT;
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)local_38);
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)local_38);
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)local_38);
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)local_38);
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare((char *)local_38);
                      if (iVar1 != 0) {
                        iVar1 = std::__cxx11::string::compare((char *)local_38);
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::string::compare((char *)local_38);
                          if (iVar1 != 0) {
                            iVar1 = std::__cxx11::string::compare((char *)local_38);
                            if (iVar1 != 0) {
                              iVar1 = std::__cxx11::string::compare((char *)local_38);
                              if (iVar1 != 0) {
                                iVar1 = std::__cxx11::string::compare((char *)local_38);
                                if (iVar1 != 0) {
                                  iVar1 = std::__cxx11::string::compare((char *)local_38);
                                  if (iVar1 != 0) {
                                    iVar1 = std::__cxx11::string::compare((char *)local_38);
                                    if (iVar1 != 0) {
                                      iVar1 = std::__cxx11::string::compare((char *)local_38);
                                      if (iVar1 != 0) {
                                        iVar1 = std::__cxx11::string::compare((char *)local_38);
                                        FVar3 = FORTRAN_FILE_FORMAT;
                                        if (iVar1 != 0) {
                                          iVar1 = std::__cxx11::string::compare((char *)local_38);
                                          if (iVar1 != 0) {
                                            iVar1 = std::__cxx11::string::compare((char *)local_38);
                                            if (iVar1 != 0) {
                                              iVar1 = std::__cxx11::string::compare
                                                                ((char *)local_38);
                                              if (iVar1 != 0) {
                                                iVar1 = std::__cxx11::string::compare
                                                                  ((char *)local_38);
                                                if (iVar1 != 0) {
                                                  iVar1 = std::__cxx11::string::compare
                                                                    ((char *)local_38);
                                                  if (iVar1 != 0) {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)local_38);
                                                    if (iVar1 != 0) {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)local_38);
                                                      if (iVar1 != 0) {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)local_38);
                                                        if (iVar1 != 0) {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)local_38);
                                                          if (iVar1 != 0) {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)local_38);
                                                            if (iVar1 != 0) {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)local_38);
                                                              if (iVar1 != 0) {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)local_38);
                                                                FVar3 = JAVA_FILE_FORMAT;
                                                                if (iVar1 != 0) {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)local_38);
                                                                  if (iVar1 != 0) {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)local_38
                                                                                   );
                                                                    FVar3 = HEADER_FILE_FORMAT;
                                                                    if (iVar1 != 0) {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)
                                                  local_38);
                                                  if (iVar1 != 0) {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)local_38);
                                                    if (iVar1 != 0) {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)local_38);
                                                      if (iVar1 != 0) {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)local_38);
                                                        if (iVar1 != 0) {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)local_38);
                                                          if (iVar1 != 0) {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)local_38);
                                                            if (iVar1 != 0) {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)local_38);
                                                              if (iVar1 != 0) {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)local_38);
                                                                if (iVar1 != 0) {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)local_38);
                                                                  if (iVar1 != 0) {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)local_38
                                                                                   );
                                                                    if (iVar1 != 0) {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)
                                                  local_38);
                                                  if (iVar1 != 0) {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)local_38);
                                                    if (iVar1 != 0) {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)local_38);
                                                      if (iVar1 != 0) {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)local_38);
                                                        if (iVar1 != 0) {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)local_38);
                                                          if (iVar1 != 0) {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)local_38);
                                                            FVar3 = RESOURCE_FILE_FORMAT;
                                                            if (iVar1 != 0) {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)local_38);
                                                              if (iVar1 != 0) {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)local_38);
                                                                FVar3 = DEFINITION_FILE_FORMAT;
                                                                if (iVar1 != 0) {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)local_38);
                                                                  if (iVar1 != 0) {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)local_38
                                                                                   );
                                                                    FVar3 = 
                                                  STATIC_LIBRARY_FILE_FORMAT;
                                                  if (iVar1 != 0) {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)local_38);
                                                    if (iVar1 != 0) {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)local_38);
                                                      if (iVar1 != 0) {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)local_38);
                                                        if (iVar1 != 0) {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)local_38);
                                                          FVar3 = OBJECT_FILE_FORMAT;
                                                          if (iVar1 != 0) {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)local_38);
                                                            if (iVar1 != 0) {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)local_38);
                                                              if (iVar1 != 0) {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)local_38);
                                                                if (iVar1 != 0) {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)local_38);
                                                                  FVar3 = SHARED_LIBRARY_FILE_FORMAT
                                                                  ;
                                                                  if (iVar1 != 0) {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)local_38
                                                                                   );
                                                                    if (iVar1 != 0) {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)
                                                  local_38);
                                                  if (iVar1 != 0) {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)local_38);
                                                    if (iVar1 != 0) {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)local_38);
                                                      if (iVar1 != 0) {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)local_38);
                                                        FVar3 = (uint)(iVar1 != 0) * 3 +
                                                                SHARED_LIBRARY_FILE_FORMAT;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return FVar3;
}

Assistant:

cmSystemTools::FileFormat cmSystemTools::GetFileFormat(const char* cext)
{
  if (!cext || *cext == 0) {
    return cmSystemTools::NO_FILE_FORMAT;
  }
  // std::string ext = cmSystemTools::LowerCase(cext);
  std::string ext = cext;
  if (ext == "c" || ext == ".c" || ext == "m" || ext == ".m") {
    return cmSystemTools::C_FILE_FORMAT;
  }
  if (ext == "C" || ext == ".C" || ext == "M" || ext == ".M" || ext == "c++" ||
      ext == ".c++" || ext == "cc" || ext == ".cc" || ext == "cpp" ||
      ext == ".cpp" || ext == "cxx" || ext == ".cxx" || ext == "mm" ||
      ext == ".mm") {
    return cmSystemTools::CXX_FILE_FORMAT;
  }
  if (ext == "f" || ext == ".f" || ext == "F" || ext == ".F" || ext == "f77" ||
      ext == ".f77" || ext == "f90" || ext == ".f90" || ext == "for" ||
      ext == ".for" || ext == "f95" || ext == ".f95") {
    return cmSystemTools::FORTRAN_FILE_FORMAT;
  }
  if (ext == "java" || ext == ".java") {
    return cmSystemTools::JAVA_FILE_FORMAT;
  }
  if (ext == "H" || ext == ".H" || ext == "h" || ext == ".h" || ext == "h++" ||
      ext == ".h++" || ext == "hm" || ext == ".hm" || ext == "hpp" ||
      ext == ".hpp" || ext == "hxx" || ext == ".hxx" || ext == "in" ||
      ext == ".in" || ext == "txx" || ext == ".txx") {
    return cmSystemTools::HEADER_FILE_FORMAT;
  }
  if (ext == "rc" || ext == ".rc") {
    return cmSystemTools::RESOURCE_FILE_FORMAT;
  }
  if (ext == "def" || ext == ".def") {
    return cmSystemTools::DEFINITION_FILE_FORMAT;
  }
  if (ext == "lib" || ext == ".lib" || ext == "a" || ext == ".a") {
    return cmSystemTools::STATIC_LIBRARY_FILE_FORMAT;
  }
  if (ext == "o" || ext == ".o" || ext == "obj" || ext == ".obj") {
    return cmSystemTools::OBJECT_FILE_FORMAT;
  }
#ifdef __APPLE__
  if (ext == "dylib" || ext == ".dylib") {
    return cmSystemTools::SHARED_LIBRARY_FILE_FORMAT;
  }
  if (ext == "so" || ext == ".so" || ext == "bundle" || ext == ".bundle") {
    return cmSystemTools::MODULE_FILE_FORMAT;
  }
#else  // __APPLE__
  if (ext == "so" || ext == ".so" || ext == "sl" || ext == ".sl" ||
      ext == "dll" || ext == ".dll") {
    return cmSystemTools::SHARED_LIBRARY_FILE_FORMAT;
  }
#endif // __APPLE__
  return cmSystemTools::UNKNOWN_FILE_FORMAT;
}